

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb.cc
# Opt level: O2

void CB::parse_label(parser *p,shared_data *param_2,void *v,v_array<substring> *words)

{
  v_array<substring> *ret;
  substring *psVar1;
  substring *psVar2;
  bool bVar3;
  uint64_t uVar4;
  ostream *poVar5;
  vw_exception *pvVar6;
  char *str;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  anon_union_4_2_947300a4 x;
  float fVar10;
  substring s;
  substring ss;
  cb_class f;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream __msg;
  ostream local_1a8;
  
  ret = &p->parse_name;
  lVar7 = 8;
  uVar9 = 0;
  do {
    psVar1 = words->_begin;
    if ((ulong)((long)words->_end - (long)psVar1 >> 4) <= uVar9) {
      return;
    }
    s.end = *(char **)((long)&psVar1->begin + lVar7);
    s.begin = *(char **)((long)psVar1 + lVar7 + -8);
    tokenize<v_array<substring>>(':',s,ret,false);
    psVar1 = (p->parse_name)._begin;
    psVar2 = (p->parse_name)._end;
    if ((psVar2 == psVar1) || (0x30 < (ulong)((long)psVar2 - (long)psVar1))) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      poVar5 = std::operator<<(&local_1a8,"malformed cost specification: ");
      ::operator<<(poVar5,ret);
      pvVar6 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cb.cc"
                 ,0x7a,&local_1d8);
      __cxa_throw(pvVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    f.partial_prediction = 0.0;
    uVar4 = hashstring(*psVar1,0);
    f.action = (uint32_t)uVar4;
    f.cost = 3.4028235e+38;
    psVar1 = (p->parse_name)._begin;
    if (0x10 < (ulong)((long)(p->parse_name)._end - (long)psVar1)) {
      f.cost = float_of_substring(psVar1[1]);
      if ((~(uint)f.cost & 0x7fc00000) == 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        poVar5 = std::operator<<(&local_1a8,"error NaN cost (");
        poVar5 = ::operator<<(poVar5,ret->_begin + 1);
        poVar5 = std::operator<<(poVar5," for action: ");
        ::operator<<(poVar5,ret->_begin);
        pvVar6 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cb.cc"
                   ,0x84,&local_1f8);
        __cxa_throw(pvVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
    f.probability = 0.0;
    psVar1 = (p->parse_name)._begin;
    str = (char *)((long)(p->parse_name)._end - (long)psVar1);
    if ((char *)0x20 < str) {
      f.probability = float_of_substring(psVar1[2]);
    }
    if ((~(uint)f.probability & 0x7fc00000) == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      poVar5 = std::operator<<(&local_1a8,"error NaN probability (");
      poVar5 = ::operator<<(poVar5,ret->_begin + 2);
      poVar5 = std::operator<<(poVar5," for action: ");
      ::operator<<(poVar5,ret->_begin);
      pvVar6 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cb.cc"
                 ,0x8b,&local_218);
      __cxa_throw(pvVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    fVar10 = 1.0;
    pcVar8 = "invalid probability > 1 specified for an action, resetting to 1.";
    if (1.0 < f.probability) {
LAB_0020dd3c:
      poVar5 = std::operator<<((ostream *)&std::cerr,pcVar8);
      std::endl<char,std::char_traits<char>>(poVar5);
      f.probability = fVar10;
    }
    else {
      fVar10 = 0.0;
      pcVar8 = "invalid probability < 0 specified for an action, resetting to 0.";
      if (f.probability < 0.0) goto LAB_0020dd3c;
    }
    psVar1 = ret->_begin;
    ss.end = "shared";
    ss.begin = psVar1->end;
    bVar3 = substring_eq((CB *)psVar1->begin,ss,str);
    if (bVar3) {
      if ((long)(p->parse_name)._end - (long)psVar1 == 0x10) {
        f.probability = -1.0;
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "shared feature vectors should not have costs");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
    }
    v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)v,&f);
    uVar9 = uVar9 + 1;
    lVar7 = lVar7 + 0x10;
  } while( true );
}

Assistant:

void parse_label(parser* p, shared_data*, void* v, v_array<substring>& words)
{
  CB::label* ld = (CB::label*)v;
  for (size_t i = 0; i < words.size(); i++)
  {
    cb_class f;
    tokenize(':', words[i], p->parse_name);

    if (p->parse_name.size() < 1 || p->parse_name.size() > 3)
      THROW("malformed cost specification: " << p->parse_name);

    f.partial_prediction = 0.;
    f.action = (uint32_t)hashstring(p->parse_name[0], 0);
    f.cost = FLT_MAX;

    if (p->parse_name.size() > 1)
      f.cost = float_of_substring(p->parse_name[1]);

    if (nanpattern(f.cost))
      THROW("error NaN cost (" << p->parse_name[1] << " for action: " << p->parse_name[0]);

    f.probability = .0;
    if (p->parse_name.size() > 2)
      f.probability = float_of_substring(p->parse_name[2]);

    if (nanpattern(f.probability))
      THROW("error NaN probability (" << p->parse_name[2] << " for action: " << p->parse_name[0]);

    if (f.probability > 1.0)
    {
      cerr << "invalid probability > 1 specified for an action, resetting to 1." << endl;
      f.probability = 1.0;
    }
    if (f.probability < 0.0)
    {
      cerr << "invalid probability < 0 specified for an action, resetting to 0." << endl;
      f.probability = .0;
    }
    if (substring_eq(p->parse_name[0], "shared"))
    {
      if (p->parse_name.size() == 1)
      {
        f.probability = -1.f;
      }
      else
        cerr << "shared feature vectors should not have costs" << endl;
    }

    ld->costs.push_back(f);
  }
}